

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discrete_dist.hpp
# Opt level: O0

void __thiscall
trng::discrete_dist::param_type::
param_type<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
          (param_type *this,
          __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first,
          __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last)

{
  allocator_type *in_RSI;
  vector<double,_std::allocator<double>_> *in_stack_00000028;
  param_type *in_stack_00000030;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffd8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffe0;
  
  std::allocator<double>::allocator((allocator<double> *)0x39600f);
  std::vector<double,std::allocator<double>>::
  vector<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,void>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_RSI);
  param_type(in_stack_00000030,in_stack_00000028);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffffb0);
  std::allocator<double>::~allocator((allocator<double> *)0x39604e);
  return;
}

Assistant:

explicit param_type(iter first, iter last)
          : param_type{std::vector<double>(first, last)} {}